

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# G1.c
# Opt level: O0

void G1_mul(G1 *rop,G1 *op,BIGNUM *scalar,ATE_CTX *ctx)

{
  ATE_CTX *in_stack_000008a8;
  G1 *in_stack_000008b0;
  BIGNUM *in_stack_000008b8;
  G1 *in_stack_000008c0;
  
  G1_windowed_mul(in_stack_000008c0,in_stack_000008b8,in_stack_000008b0,in_stack_000008a8);
  return;
}

Assistant:

void G1_mul(G1 *rop, const G1 *op, const BIGNUM *scalar, const ATE_CTX *ctx)
{
    // int i;
    // G1 r;
    // G1_set(&r, op);

    // for(i = BN_num_bits(scalar) - 1; i > 0; i--)
    // {
    //     G1_double(&r, &r, ctx);
    //     if(BN_is_bit_set(scalar, i - 1)) 
    //     {
    //         G1_add(&r, &r, op, ctx);
    //     }
    // }
    // G1_set(rop, &r);
    G1_windowed_mul(rop, scalar, op, ctx);
}